

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall
mjs::object::debug_print(object *this,wostream *os,int indent_incr,int max_nest,int indent)

{
  uint32_t uVar1;
  uint uVar2;
  wchar_t indent_00;
  int iVar3;
  wostream *pwVar4;
  gc_vector<mjs::object::property> *pgVar5;
  gc_table *pgVar6;
  gc_table *pgVar7;
  gc_table *pgVar8;
  uint *puVar9;
  int iVar10;
  undefined4 in_register_0000000c;
  gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>::gc_table,_true> *this_00;
  gc_heap *h;
  size_type __rlen;
  bool bVar11;
  wstring indent_string;
  undefined1 local_c8 [8];
  undefined1 local_c0 [32];
  undefined8 local_a0;
  wchar_t *local_98;
  long local_90;
  long local_88 [2];
  undefined1 local_78 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_70;
  undefined1 local_50 [32];
  
  local_a0 = CONCAT44(in_register_0000000c,max_nest);
  if ((max_nest < 1) || (4 < indent / indent_incr)) {
    pwVar4 = std::operator<<(os,"[Object ");
    class_name((object *)local_c8);
    pwVar4 = mjs::operator<<(pwVar4,(string *)local_c8);
    std::operator<<(pwVar4,"]");
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c8);
  }
  else {
    indent_00 = indent_incr + indent;
    local_98 = (wchar_t *)local_88;
    std::__cxx11::wstring::_M_construct((ulong)&local_98,indent_00);
    std::operator<<(os,"{\n");
    class_name((object *)local_78);
    pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_98,local_90);
    pwVar4 = std::operator<<(pwVar4,"[[Class]]");
    std::operator<<(pwVar4,": ");
    local_c8._0_4_ = string;
    local_c0._0_8_ = CONCAT44(local_78._4_4_,local_78._0_4_);
    local_c0._8_4_ = local_70._0_4_;
    if ((gc_heap *)local_c0._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0._0_8_,(gc_heap_ptr_untyped *)local_c0);
    }
    iVar10 = (uint)local_a0 - 1;
    iVar3 = 1;
    if ((uint)local_a0 < 2) {
      iVar3 = iVar10;
    }
    mjs::debug_print(os,(value *)local_c8,indent_incr,iVar3,indent_00);
    value::destroy((value *)local_c8);
    std::operator<<(os,"\n");
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_78);
    uVar1 = (this->prototype_).pos_;
    if (uVar1 == 0) {
      value::value((value *)local_78,(value *)value::null);
    }
    else {
      gc_heap::unsafe_create_from_position<mjs::object>((gc_heap *)local_50,(uint32_t)this->heap_);
      local_78._0_4_ = object;
      local_70.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           (gc_heap *)local_50._0_8_;
      local_70.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_50._8_4_;
      if ((gc_heap *)local_50._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_50._0_8_,(gc_heap_ptr_untyped *)(local_78 + 8));
      }
    }
    pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_98,local_90);
    pwVar4 = std::operator<<(pwVar4,"[[Prototype]]");
    std::operator<<(pwVar4,": ");
    value::value((value *)local_c8,(value *)local_78);
    mjs::debug_print(os,(value *)local_c8,indent_incr,iVar3,indent_00);
    value::destroy((value *)local_c8);
    std::operator<<(os,"\n");
    value::destroy((value *)local_78);
    if (uVar1 != 0) {
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_50);
    }
    local_50._16_8_ = (slot *)(ulong)(uint)indent;
    pgVar5 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                       (&this->properties_,this->heap_);
    this_00 = &pgVar5->table_;
    pgVar6 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>::gc_table,_true>::
             dereference(this_00,pgVar5->heap_);
    pgVar7 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>::gc_table,_true>::
             dereference(this_00,pgVar5->heap_);
    pgVar8 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>::gc_table,_true>::
             dereference(this_00,pgVar5->heap_);
    if (pgVar6 != pgVar7 + pgVar8->length_) {
      local_50._24_8_ = pgVar7 + (ulong)pgVar8->length_ + 1;
      h = (gc_heap *)(pgVar6 + 1);
      do {
        property::key((property *)local_c8,h);
        puVar9 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_c8);
        uVar2 = *puVar9;
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_c8);
        property::get((value *)local_78,(property *)h,this);
        if (uVar2 == 0xb) {
          iVar3 = wmemcmp((wchar_t *)(puVar9 + 1),L"constructor",(ulong)uVar2);
          bVar11 = iVar3 == 0;
        }
        else {
          bVar11 = false;
        }
        pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_98,local_90);
        pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                           (pwVar4,(wchar_t *)(puVar9 + 1),(ulong)uVar2);
        std::operator<<(pwVar4,": ");
        value::value((value *)local_c8,(value *)local_78);
        iVar3 = 1;
        if (!bVar11) {
          iVar3 = iVar10;
        }
        if ((uint)local_a0 < 2) {
          iVar3 = iVar10;
        }
        mjs::debug_print(os,(value *)local_c8,indent_incr,iVar3,indent_00);
        value::destroy((value *)local_c8);
        std::operator<<(os,"\n");
        value::destroy((value *)local_78);
        h = (gc_heap *)&h->alloc_context_;
      } while (h != (gc_heap *)local_50._24_8_);
    }
    (*this->_vptr_object[8])(this,os,(ulong)(uint)indent_incr,local_a0,(ulong)(uint)indent_00);
    local_c8 = (undefined1  [8])(local_c0 + 8);
    std::__cxx11::wstring::_M_construct((ulong)local_c8,(wchar_t)local_50._16_8_);
    pwVar4 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (os,(wchar_t *)local_c8,local_c0._0_8_);
    std::operator<<(pwVar4,"}");
    if (local_c8 != (undefined1  [8])(local_c0 + 8)) {
      operator_delete((void *)local_c8,CONCAT44(local_c0._12_4_,local_c0._8_4_) * 4 + 4);
    }
    if (local_98 != (wchar_t *)local_88) {
      operator_delete(local_98,local_88[0] * 4 + 4);
    }
  }
  return;
}

Assistant:

void object::debug_print(std::wostream& os, int indent_incr, int max_nest, int indent) const {
    if (indent / indent_incr > 4 || max_nest <= 0) {
        os << "[Object " << class_name() << "]";
        return;
    }
    auto indent_string = std::wstring(indent + indent_incr, ' ');
    auto print_prop = [&](const auto& name, const auto& val, bool internal) {
        os << indent_string << name << ": ";
        mjs::debug_print(os, mjs::value{val}, indent_incr, max_nest > 1 && internal ? 1 : max_nest - 1, indent + indent_incr);
        os << "\n";
    };
    os << "{\n";
    print_prop("[[Class]]", class_name(), true);
    print_prop("[[Prototype]]", prototype_ ? value{prototype_.track(heap())} : value::null, true);
    for (auto& p: properties_.dereference(heap_)) {
        const auto key = p.key(heap_).view();
        print_prop(key, p.get(*this), key == L"constructor");
    }
    do_debug_print_extra(os, indent_incr, max_nest, indent+indent_incr);
    os << std::wstring(indent, ' ') << "}";
}